

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

void zt_log_close(zt_log_ty *log)

{
  _func_void_zt_log_ty_ptr *UNRECOVERED_JUMPTABLE;
  
  if (log != (zt_log_ty *)0x0) {
    if (log_default_ptr == log) {
      zt_log_set_logger((zt_log_ty *)0x0);
    }
    UNRECOVERED_JUMPTABLE = log->vtbl->destructor;
    if (UNRECOVERED_JUMPTABLE != (_func_void_zt_log_ty_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(log);
      return;
    }
  }
  return;
}

Assistant:

void
zt_log_close(zt_log_ty * log) {
    if (!log) {
        return;
    }

    if (log == log_default_ptr) {
        zt_log_set_logger(NULL);
    }

    if (log->vtbl->destructor) {
        log->vtbl->destructor(log);
    }
}